

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O3

size_t meshopt_generateVertexRemap
                 (uint *destination,uint *indices,size_t index_count,void *vertices,
                 size_t vertex_count,size_t vertex_size)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint *table;
  uint *puVar4;
  uint uVar5;
  ulong buckets;
  long lVar6;
  uint uVar7;
  size_t sVar8;
  VertexHasher hasher;
  VertexHasher local_110;
  uint *local_f8 [25];
  
  memset(local_f8,0,200);
  memset(destination,0xff,vertex_count * 4);
  uVar2 = 1;
  do {
    buckets = uVar2;
    uVar2 = buckets * 2;
  } while (buckets < (vertex_count >> 2) + vertex_count);
  local_110.vertices = (uchar *)vertices;
  local_110.vertex_size = vertex_size;
  local_110.vertex_stride = vertex_size;
  table = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)
                            (-(ulong)(buckets >> 0x3e != 0) | buckets * 4);
  local_f8[0] = table;
  memset(table,0xff,buckets * 4);
  sVar8 = 0;
  if (index_count != 0) {
    uVar1 = 0;
    sVar8 = 0;
    do {
      if (indices == (uint *)0x0) {
        uVar7 = (uint)sVar8;
      }
      else {
        uVar7 = indices[sVar8];
      }
      if (destination[uVar7] == 0xffffffff) {
        puVar4 = meshopt::hashLookup<unsigned_int,meshopt::VertexHasher>
                           (table,buckets,&local_110,(uint *)(ulong)uVar7,(uint *)0xffffffff);
        if ((ulong)*puVar4 == 0xffffffff) {
          *puVar4 = uVar7;
          uVar5 = uVar1 + 1;
          uVar3 = uVar1;
        }
        else {
          uVar3 = destination[*puVar4];
          uVar5 = uVar1;
        }
        destination[uVar7] = uVar3;
        uVar1 = uVar5;
      }
      sVar8 = sVar8 + 1;
    } while (index_count != sVar8);
    sVar8 = (size_t)uVar1;
  }
  for (lVar6 = 0; lVar6 != -1; lVar6 = lVar6 + -1) {
    (*meshopt_Allocator::StorageT<void>::deallocate)(local_f8[lVar6]);
  }
  return sVar8;
}

Assistant:

size_t meshopt_generateVertexRemap(unsigned int* destination, const unsigned int* indices, size_t index_count, const void* vertices, size_t vertex_count, size_t vertex_size)
{
	using namespace meshopt;

	assert(indices || index_count == vertex_count);
	assert(index_count % 3 == 0);
	assert(vertex_size > 0 && vertex_size <= 256);

	meshopt_Allocator allocator;

	memset(destination, -1, vertex_count * sizeof(unsigned int));

	VertexHasher hasher = {static_cast<const unsigned char*>(vertices), vertex_size, vertex_size};

	size_t table_size = hashBuckets(vertex_count);
	unsigned int* table = allocator.allocate<unsigned int>(table_size);
	memset(table, -1, table_size * sizeof(unsigned int));

	unsigned int next_vertex = 0;

	for (size_t i = 0; i < index_count; ++i)
	{
		unsigned int index = indices ? indices[i] : unsigned(i);
		assert(index < vertex_count);

		if (destination[index] == ~0u)
		{
			unsigned int* entry = hashLookup(table, table_size, hasher, index, ~0u);

			if (*entry == ~0u)
			{
				*entry = index;

				destination[index] = next_vertex++;
			}
			else
			{
				assert(destination[*entry] != ~0u);

				destination[index] = destination[*entry];
			}
		}
	}

	assert(next_vertex <= vertex_count);

	return next_vertex;
}